

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O3

bool dg::pta::PointerAnalysisFS::mergeObjects
               (PSNode *node,MemoryObject *to,MemoryObject *from,PointsToSetT *overwritten)

{
  undefined8 *puVar1;
  _Base_ptr p_Var2;
  ulong uVar3;
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  *this;
  bool bVar4;
  IDTy i;
  mapped_type *this_00;
  _Base_ptr p_Var5;
  byte bVar6;
  bool bVar7;
  const_iterator __begin3;
  const_iterator local_78;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_60;
  PointsToMapT *local_58;
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  *local_50;
  _Rb_tree_node_base *local_48;
  Pointer local_40;
  
  p_Var5 = (from->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48 = &(from->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 == local_48) {
    bVar7 = false;
  }
  else {
    local_58 = &to->pointsTo;
    bVar7 = false;
    local_60._M_cur = (__node_type *)node;
    local_50 = &overwritten->pointers;
    do {
      this = local_50;
      if (local_50 ==
          (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
           *)0x0) {
LAB_001128ad:
        this_00 = std::
                  map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
                  ::operator[](local_58,(key_type *)(p_Var5 + 1));
        local_78.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
             p_Var5[1]._M_right;
        local_78.container_end.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
             (__node_type *)0x0;
        local_78.pos = 0;
        if (*(long *)(p_Var5 + 2) != 0) {
          p_Var2 = *(_Base_ptr *)
                    ((long)&(((__node_type *)
                             local_78.container_it.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                             ._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                            ._M_storage._M_storage + 8);
          local_78.pos = 0;
          uVar3 = (ulong)p_Var2 & 1;
          while (uVar3 == 0) {
            if (local_78.pos == 0x3f) {
              local_78.pos = 0x40;
              break;
            }
            bVar6 = (byte)local_78.pos;
            local_78.pos = local_78.pos + 1;
            uVar3 = (ulong)p_Var2 >> (bVar6 & 0x3f) & 2;
          }
        }
        if ((local_78.pos != 0) ||
           (local_78.container_it.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
            != (__node_type *)0x0)) {
          do {
            puVar1 = (undefined8 *)
                     ((long)*(_Base_ptr *)
                             ((long)local_78.container_it.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                    ._M_cur + 8) * 0x10 + -0x10 + local_78.pos * 0x10 + _getConstant
                     );
            local_40.target = (PSNode *)*puVar1;
            local_40.offset.offset = puVar1[1];
            bVar4 = PointerIdPointsToSet::add(this_00,&local_40);
            bVar7 = (bool)(bVar7 | bVar4);
            ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::const_iterator::operator++(&local_78);
          } while (local_78.container_it.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                   _M_cur != (__node_type *)0x0 || local_78.pos != 0);
        }
      }
      else {
        local_78.container_end.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             *(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
              (p_Var5 + 1);
        local_78.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
             (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
             local_60._M_cur;
        i = PointerIDLookupTable::getOrCreate
                      ((PointerIDLookupTable *)&PointerIdPointsToSet::lookupTable,
                       (Pointer *)&local_78);
        bVar4 = ADT::
                SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                ::get(this,i);
        if (!bVar4) goto LAB_001128ad;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_48);
  }
  return bVar7;
}

Assistant:

static bool mergeObjects(PSNode *node, MemoryObject *to, MemoryObject *from,
                             PointsToSetT *overwritten) {
        bool changed = false;

        for (auto &fromIt : from->pointsTo) {
            if (overwritten && overwritten->count(Pointer(node, fromIt.first)))
                continue;

            auto &S = to->pointsTo[fromIt.first];
            for (const auto &ptr : fromIt.second)
                changed |= S.add(ptr);
        }

        return changed;
    }